

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_signatureutil.cpp
# Opt level: O0

void __thiscall
SignatureUtil_CalculateEcSignature_Test::TestBody(SignatureUtil_CalculateEcSignature_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_250;
  Message local_248;
  string local_240;
  undefined1 local_220 [8];
  AssertionResult gtest_ar_2;
  Message local_208 [2];
  CfdException *anon_var_0;
  ByteData local_1d8;
  byte local_1b9;
  char *pcStack_1b8;
  bool gtest_caught_expected;
  ConstCharPtr gtest_msg;
  ByteData err_sig;
  Message local_190;
  string local_188;
  undefined1 local_168 [8];
  AssertionResult gtest_ar_1;
  Message local_150;
  ByteData local_148;
  AssertHelper local_130;
  Message local_128;
  string local_120;
  undefined1 local_100 [8];
  AssertionResult gtest_ar;
  Message local_e8 [2];
  ByteData local_d8;
  undefined1 local_c0 [8];
  ByteData sig;
  string local_a0;
  undefined1 local_80 [8];
  Privkey privkey;
  allocator local_49;
  string local_48;
  undefined1 local_28 [8];
  ByteData256 sighash;
  SignatureUtil_CalculateEcSignature_Test *this_local;
  
  sighash.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_48,"2a67f03e63a6a422125878b40b82da593be8d4efaafe88ee528af6e5a9955c6e",
             &local_49);
  cfd::core::ByteData256::ByteData256((ByteData256 *)local_28,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_a0,"305e293b010d29bf3c888b617763a438fee9054c8cab66eb12ad078f819d9f27",
             (allocator *)
             ((long)&sig.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  cfd::core::Privkey::Privkey((Privkey *)local_80,&local_a0,kMainnet,true);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&sig.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  cfd::core::ByteData::ByteData((ByteData *)local_c0);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::SignatureUtil::CalculateEcSignature
                (&local_d8,(ByteData256 *)local_28,(Privkey *)local_80,true);
      cfd::core::ByteData::operator=((ByteData *)local_c0,&local_d8);
      cfd::core::ByteData::~ByteData(&local_d8);
    }
  }
  else {
    testing::Message::Message(local_e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_signatureutil.cpp"
               ,0x19,
               "Expected: sig = SignatureUtil::CalculateEcSignature(sighash, privkey, true) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar.message_,local_e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
    testing::Message::~Message(local_e8);
  }
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_120,(ByteData *)local_c0);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_100,"sig.GetHex().c_str()",
             "\"0e68b55347fe37338beb3c28920267c5915a0c474d1dcafc65b087b9b3819cae6ae5e8fb12d669a63127abb4724070f8bd232a9efe3704e6544296a843a64f2c\""
             ,pcVar2,
             "0e68b55347fe37338beb3c28920267c5915a0c474d1dcafc65b087b9b3819cae6ae5e8fb12d669a63127abb4724070f8bd232a9efe3704e6544296a843a64f2c"
            );
  std::__cxx11::string::~string((string *)&local_120);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_100);
  if (!bVar1) {
    testing::Message::Message(&local_128);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_100);
    testing::internal::AssertHelper::AssertHelper
              (&local_130,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_signatureutil.cpp"
               ,0x1c,pcVar2);
    testing::internal::AssertHelper::operator=(&local_130,&local_128);
    testing::internal::AssertHelper::~AssertHelper(&local_130);
    testing::Message::~Message(&local_128);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_100);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::SignatureUtil::CalculateEcSignature
                (&local_148,(ByteData256 *)local_28,(Privkey *)local_80,false);
      cfd::core::ByteData::operator=((ByteData *)local_c0,&local_148);
      cfd::core::ByteData::~ByteData(&local_148);
    }
  }
  else {
    testing::Message::Message(&local_150);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_signatureutil.cpp"
               ,0x20,
               "Expected: sig = SignatureUtil::CalculateEcSignature(sighash, privkey, false) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_150);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_150);
  }
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_188,(ByteData *)local_c0);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_168,"sig.GetHex().c_str()",
             "\"0e68b55347fe37338beb3c28920267c5915a0c474d1dcafc65b087b9b3819cae6ae5e8fb12d669a63127abb4724070f8bd232a9efe3704e6544296a843a64f2c\""
             ,pcVar2,
             "0e68b55347fe37338beb3c28920267c5915a0c474d1dcafc65b087b9b3819cae6ae5e8fb12d669a63127abb4724070f8bd232a9efe3704e6544296a843a64f2c"
            );
  std::__cxx11::string::~string((string *)&local_188);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_168);
  if (!bVar1) {
    testing::Message::Message(&local_190);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_168);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &err_sig.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_signatureutil.cpp"
               ,0x23,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &err_sig.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,&local_190);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &err_sig.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(&local_190);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_168);
  cfd::core::ByteData::ByteData((ByteData *)&gtest_msg);
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xfffffffffffffe48,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xfffffffffffffe48);
  if (bVar1) {
    local_1b9 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Privkey::Privkey((Privkey *)&anon_var_0);
      cfd::core::SignatureUtil::CalculateEcSignature
                (&local_1d8,(ByteData256 *)local_28,(Privkey *)&anon_var_0,true);
      cfd::core::ByteData::operator=((ByteData *)&gtest_msg,&local_1d8);
      cfd::core::ByteData::~ByteData(&local_1d8);
      cfd::core::Privkey::~Privkey((Privkey *)&anon_var_0);
    }
    if ((local_1b9 & 1) != 0) goto LAB_003fd9db;
    pcStack_1b8 = 
    "Expected: (err_sig = SignatureUtil::CalculateEcSignature(sighash, Privkey(), true)) throws an exception of type CfdException.\n  Actual: it throws nothing."
    ;
  }
  testing::Message::Message(local_208);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_signatureutil.cpp"
             ,0x28,pcStack_1b8);
  testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,local_208);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
  testing::Message::~Message(local_208);
LAB_003fd9db:
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_240,(ByteData *)&gtest_msg);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_220,"err_sig.GetHex().c_str()","\"\"",pcVar2,"");
  std::__cxx11::string::~string((string *)&local_240);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_220);
  if (!bVar1) {
    testing::Message::Message(&local_248);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_220);
    testing::internal::AssertHelper::AssertHelper
              (&local_250,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_signatureutil.cpp"
               ,0x29,pcVar2);
    testing::internal::AssertHelper::operator=(&local_250,&local_248);
    testing::internal::AssertHelper::~AssertHelper(&local_250);
    testing::Message::~Message(&local_248);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_220);
  cfd::core::ByteData::~ByteData((ByteData *)&gtest_msg);
  cfd::core::ByteData::~ByteData((ByteData *)local_c0);
  cfd::core::Privkey::~Privkey((Privkey *)local_80);
  cfd::core::ByteData256::~ByteData256((ByteData256 *)local_28);
  return;
}

Assistant:

TEST(SignatureUtil, CalculateEcSignature) {
  ByteData256 sighash(
      "2a67f03e63a6a422125878b40b82da593be8d4efaafe88ee528af6e5a9955c6e");
  Privkey privkey(
      "305e293b010d29bf3c888b617763a438fee9054c8cab66eb12ad078f819d9f27");

  // has_grind_r true
  ByteData sig;
  EXPECT_NO_THROW(
      sig = SignatureUtil::CalculateEcSignature(sighash, privkey, true));
  EXPECT_STREQ(
      sig.GetHex().c_str(),
      "0e68b55347fe37338beb3c28920267c5915a0c474d1dcafc65b087b9b3819cae6ae5e8fb12d669a63127abb4724070f8bd232a9efe3704e6544296a843a64f2c");

  // has_grind_r false
  EXPECT_NO_THROW(
      sig = SignatureUtil::CalculateEcSignature(sighash, privkey, false));
  EXPECT_STREQ(
      sig.GetHex().c_str(),
      "0e68b55347fe37338beb3c28920267c5915a0c474d1dcafc65b087b9b3819cae6ae5e8fb12d669a63127abb4724070f8bd232a9efe3704e6544296a843a64f2c");

  ByteData err_sig;
  EXPECT_THROW(
      (err_sig = SignatureUtil::CalculateEcSignature(sighash, Privkey(), true)),
      CfdException);
  EXPECT_STREQ(err_sig.GetHex().c_str(), "");
}